

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_index_t pos)

{
  internalJSONNode *piVar1;
  json_index_t jVar2;
  out_of_range *this_00;
  string *psVar3;
  
  piVar1 = this->internal;
  jVar2 = 0;
  if (0xfd < (byte)(piVar1->_type - 6)) {
    internalJSONNode::Fetch(piVar1);
    jVar2 = piVar1->Children->mysize;
  }
  if (pos < jVar2) {
    piVar1 = this->internal;
    internalJSONNode::Fetch(piVar1);
    return piVar1->Children->array[pos];
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("at() const out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    return (*this)[pos];
}